

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualConstraintViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  type_conflict5 tVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  int col;
  long lVar3;
  Item *pIVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  cpp_dec_float<100U,_int,_void> local_1f8;
  cpp_dec_float<100U,_int,_void> *local_1a0;
  long local_198;
  type local_190;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_140;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  local_1a0 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_140,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this);
  lVar3 = 0;
  do {
    if ((this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= lVar3) {
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_140);
      return;
    }
    pIVar4 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar3].idx;
    local_198 = lVar3;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_80,0.0,(type *)0x0);
    lVar5 = 0;
    for (lVar3 = 0;
        lVar3 < (pIVar4->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused; lVar3 = lVar3 + 1) {
      pNVar1 = (pIVar4->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_1f8.fpclass = cpp_dec_float_finite;
      local_1f8.prec_elem = 0x10;
      local_1f8.data._M_elems[0] = 0;
      local_1f8.data._M_elems[1] = 0;
      local_1f8.data._M_elems[2] = 0;
      local_1f8.data._M_elems[3] = 0;
      local_1f8.data._M_elems[4] = 0;
      local_1f8.data._M_elems[5] = 0;
      local_1f8.data._M_elems[6] = 0;
      local_1f8.data._M_elems[7] = 0;
      local_1f8.data._M_elems[8] = 0;
      local_1f8.data._M_elems[9] = 0;
      local_1f8.data._M_elems[10] = 0;
      local_1f8.data._M_elems[0xb] = 0;
      local_1f8.data._M_elems[0xc] = 0;
      local_1f8.data._M_elems[0xd] = 0;
      local_1f8.data._M_elems._56_5_ = 0;
      local_1f8.data._M_elems[0xf]._1_3_ = 0;
      local_1f8.exp = 0;
      local_1f8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1f8,
                 (cpp_dec_float<100U,_int,_void> *)
                 ((long)(pNVar1->val).m_backend.data._M_elems + lVar5),
                 &local_140._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&pNVar1->val + 1) + lVar5)].m_backend);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_80,&local_1f8);
      lVar5 = lVar5 + 0x54;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_1f8,0.0,(type *)0x0);
    lVar3 = local_198;
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_80,
                       (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_198);
    if (tVar2) {
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 0x10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems[6] = 0;
      local_d8.data._M_elems[7] = 0;
      local_d8.data._M_elems[8] = 0;
      local_d8.data._M_elems[9] = 0;
      local_d8.data._M_elems[10] = 0;
      local_d8.data._M_elems[0xb] = 0;
      local_d8.data._M_elems[0xc] = 0;
      local_d8.data._M_elems[0xd] = 0;
      local_d8.data._M_elems._56_5_ = 0;
      local_d8.data._M_elems[0xf]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_d8,&local_80,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar3].m_backend);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_190,(multiprecision *)&local_d8,arg);
LAB_002dfc84:
      local_1f8.data._M_elems[0xc] = local_190.m_backend.data._M_elems[0xc];
      local_1f8.data._M_elems[0xd] = local_190.m_backend.data._M_elems[0xd];
      local_1f8.data._M_elems._56_5_ = local_190.m_backend.data._M_elems._56_5_;
      local_1f8.data._M_elems[0xf]._1_3_ = local_190.m_backend.data._M_elems[0xf]._1_3_;
      local_1f8.data._M_elems[8] = local_190.m_backend.data._M_elems[8];
      local_1f8.data._M_elems[9] = local_190.m_backend.data._M_elems[9];
      local_1f8.data._M_elems[10] = local_190.m_backend.data._M_elems[10];
      local_1f8.data._M_elems[0xb] = local_190.m_backend.data._M_elems[0xb];
      local_1f8.data._M_elems[4] = local_190.m_backend.data._M_elems[4];
      local_1f8.data._M_elems[5] = local_190.m_backend.data._M_elems[5];
      local_1f8.data._M_elems[6] = local_190.m_backend.data._M_elems[6];
      local_1f8.data._M_elems[7] = local_190.m_backend.data._M_elems[7];
      local_1f8.data._M_elems[0] = local_190.m_backend.data._M_elems[0];
      local_1f8.data._M_elems[1] = local_190.m_backend.data._M_elems[1];
      local_1f8.data._M_elems[2] = local_190.m_backend.data._M_elems[2];
      local_1f8.data._M_elems[3] = local_190.m_backend.data._M_elems[3];
      local_1f8.exp = local_190.m_backend.exp;
      local_1f8.neg = local_190.m_backend.neg;
      local_1f8.fpclass = local_190.m_backend.fpclass;
      local_1f8.prec_elem = local_190.m_backend.prec_elem;
    }
    else {
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_80,
                         (this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3);
      if (tVar2) {
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 0x10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems[6] = 0;
        local_128.data._M_elems[7] = 0;
        local_128.data._M_elems[8] = 0;
        local_128.data._M_elems[9] = 0;
        local_128.data._M_elems[10] = 0;
        local_128.data._M_elems[0xb] = 0;
        local_128.data._M_elems[0xc] = 0;
        local_128.data._M_elems[0xd] = 0;
        local_128.data._M_elems._56_5_ = 0;
        local_128.data._M_elems[0xf]._1_3_ = 0;
        local_128.exp = 0;
        local_128.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_128,&local_80,
                   &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar3].m_backend);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_190,(multiprecision *)&local_128,arg_00);
        goto LAB_002dfc84;
      }
    }
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,maxviol);
    if (tVar2) {
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_1f8.data._M_elems._48_8_;
      *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_1f8.data._M_elems[0xf]._1_3_,local_1f8.data._M_elems._56_5_);
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_1f8.data._M_elems._32_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_1f8.data._M_elems._40_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_1f8.data._M_elems._16_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_1f8.data._M_elems._24_8_;
      *(undefined8 *)(maxviol->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
      *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_;
      (maxviol->m_backend).exp = local_1f8.exp;
      (maxviol->m_backend).neg = local_1f8.neg;
      (maxviol->m_backend).fpclass = local_1f8.fpclass;
      (maxviol->m_backend).prec_elem = local_1f8.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (local_1a0,&local_1f8);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}